

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Reals __thiscall Omega_h::interpolate_between(Omega_h *this,Reals *a,Reals *b,Real t)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_120;
  undefined1 local_110 [8];
  type f;
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  Write<double> out;
  LO n;
  Real t_local;
  Reals *b_local;
  Reals *a_local;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 3) == (int)(local_20 >> 3)) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    size_in = (LO)(local_30 >> 3);
    out.shared_alloc_.direct_ptr._4_4_ = size_in;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",&local_c1);
    Write<double>::Write((Write<double> *)local_a0,size_in,(string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    Write<double>::Write((Write<double> *)local_110,(Write<double> *)local_a0);
    Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,a);
    f.a.write_.shared_alloc_.direct_ptr = (void *)t;
    Read<double>::Read((Read<double> *)&f.t,b);
    parallel_for<Omega_h::interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::__0>
              (out.shared_alloc_.direct_ptr._4_4_,(type *)local_110,"interpolate_between");
    Write<double>::Write(&local_120,(Write<signed_char> *)local_a0);
    Read<double>::Read((Read<double> *)this,&local_120);
    Write<double>::~Write(&local_120);
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)local_110);
    Write<double>::~Write((Write<double> *)local_a0);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x238);
}

Assistant:

Reals interpolate_between(Reals a, Reals b, Real t) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto n = a.size();
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = a[i] * (1.0 - t) + b[i] * t; };
  parallel_for(n, f, "interpolate_between");
  return out;
}